

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void __thiscall ftxui::Screen::Clear(Screen *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Cursor CVar5;
  allocator_type local_82;
  allocator_type local_81;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> local_80;
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  local_68;
  Pixel local_50;
  
  iVar3 = this->dimy_;
  iVar4 = this->dimx_;
  Pixel::Pixel(&local_50);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
            (&local_80,(long)iVar4,&local_50,&local_81);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::vector(&local_68,(long)iVar3,&local_80,&local_82);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::_M_move_assign(&this->pixels_,&local_68);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::~vector(&local_68);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector(&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  uVar1 = this->dimx_;
  uVar2 = this->dimy_;
  CVar5.y = uVar2 + -1;
  CVar5.x = uVar1 + -1;
  this->cursor_ = CVar5;
  return;
}

Assistant:

void Screen::Clear() {
  pixels_ = std::vector<std::vector<Pixel>>(dimy_,
                                            std::vector<Pixel>(dimx_, Pixel()));
  cursor_.x = dimx_ - 1;
  cursor_.y = dimy_ - 1;
}